

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_invert_variance_full(gauden_t *g)

{
  int32 iVar1;
  undefined8 in_RAX;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = g->n_mgau;
  if (uVar2 != 0) {
    uVar4 = g->n_feat;
    uVar6 = (ulong)uVar4;
    uVar5 = 0;
    do {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar3 = (ulong)g->n_density;
        uVar7 = 0;
        do {
          if ((int)uVar3 == 0) {
            uVar3 = 0;
          }
          else {
            uVar6 = 0;
            do {
              iVar1 = invert((float32 **)g->fullvar[uVar5][uVar7][uVar6],
                             (float32 **)g->fullvar[uVar5][uVar7][uVar6],g->veclen[uVar7]);
              if (iVar1 != 0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,499,"Singular covariance matrix ([%d][%d][%d]), can\'t continue!\n",
                        uVar5 & 0xffffffff,uVar7 & 0xffffffff,
                        CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar6));
                exit(1);
              }
              uVar6 = uVar6 + 1;
              uVar3 = (ulong)g->n_density;
            } while (uVar6 < uVar3);
            uVar6 = (ulong)g->n_feat;
          }
          uVar7 = uVar7 + 1;
          uVar4 = (uint)uVar6;
        } while (uVar7 < uVar6);
        uVar2 = g->n_mgau;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  return 0;
}

Assistant:

int
gauden_invert_variance_full(gauden_t *g)
{
    uint32 i, j, k;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		/* Yes, this works in-place (we hope) */
		if (invert(g->fullvar[i][j][k], g->fullvar[i][j][k],
			   g->veclen[j]) != S3_SUCCESS) {
		    /* Shouldn't get here, due to the check in full_norm() */
		    E_FATAL("Singular covariance matrix ([%d][%d][%d]), can't continue!\n",
			    i, j, k);
		}
	    }
	}
    }

    return S3_SUCCESS;
}